

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::CpuAbsoluteIndexedTest_sre_absx_sets_c_with_pagecrossing_Test::
~CpuAbsoluteIndexedTest_sre_absx_sets_c_with_pagecrossing_Test
          (CpuAbsoluteIndexedTest_sre_absx_sets_c_with_pagecrossing_Test *this)

{
  CpuAbsoluteIndexedTest_sre_absx_sets_c_with_pagecrossing_Test *this_local;
  
  ~CpuAbsoluteIndexedTest_sre_absx_sets_c_with_pagecrossing_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, sre_absx_sets_c_with_pagecrossing) {
    registers.p = Z_FLAG;
    registers.a = 0b01110011;
    expected.a = 0b00110011;
    expected.p = C_FLAG;
    memory_content = 0b10000001;

    run_readwrite_instruction_with_pagecrossing(
            SRE_ABSX, IndexReg::X, 0b01000000);
}